

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermoParser.cpp
# Opt level: O2

bool __thiscall IO::ThermoParser::setThermoDataFor(ThermoParser *this,Species *species)

{
  pointer pTVar1;
  int iVar2;
  ulong uVar3;
  string *str;
  Thermo *this_00;
  ulong uVar4;
  long lVar5;
  string local_70 [32];
  string local_50;
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    pTVar1 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0xd8;
    if (uVar3 <= uVar4) {
LAB_0015240b:
      return uVar4 < uVar3;
    }
    str = Thermo::getSpeciesName_abi_cxx11_
                    ((Thermo *)((long)&(pTVar1->species_name_)._M_dataplus._M_p + lVar5));
    convertToCaps(&local_50,str);
    std::__cxx11::string::string(local_70,(string *)species);
    iVar2 = std::__cxx11::string::compare((string *)&local_50);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (iVar2 == 0) {
      pTVar1 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = Species::thermo(species);
      Thermo::operator=(this_00,(Thermo *)((long)&(pTVar1->species_name_)._M_dataplus._M_p + lVar5))
      ;
      goto LAB_0015240b;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0xd8;
  } while( true );
}

Assistant:

bool IO::ThermoParser::setThermoDataFor(IO::Species& species) {
    for (size_t i = 0; i < thermos_.size(); ++i) {
        if (convertToCaps(thermos_[i].getSpeciesName()).compare(species.name()) == 0) {
            species.thermo() = thermos_[i];
            return true;
        }
    }
    return false;
}